

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

int Session_destroy(Session_t *handle)

{
  ostream *poVar1;
  ShPtr<HG::SessionImpl> shptr;
  char local_19;
  ShPtr<HG::SessionImpl> local_18;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Calling destroy for session @",0x1d);
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  local_19 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_19,1);
  local_18.cblock = (ShPtrRep *)handle;
  ShPtr<HG::SessionImpl>::decref(&local_18);
  return 0;
}

Assistant:

int Session_destroy(Session_t *handle) {
    std::cout << "Calling destroy for session @" << handle << '\n';
    auto rep = HgHandles::repr(handle, HgHandles::RefCount());
    ShPtr<HG::SessionImpl> shptr(rep);
    return 0;
}